

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.h
# Opt level: O0

void __thiscall
cmList::cmList(cmList *this,cmValue list,ExpandElements expandElements,EmptyElements emptyElements)

{
  bool bVar1;
  string *value;
  EmptyElements emptyElements_local;
  ExpandElements expandElements_local;
  cmList *this_local;
  cmValue list_local;
  
  this_local = (cmList *)list.Value;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Values);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
  if (bVar1) {
    value = cmValue::operator*[abi_cxx11_((cmValue *)&this_local);
    assign(this,value,expandElements,emptyElements);
  }
  return;
}

Assistant:

cmList(cmValue list, ExpandElements expandElements = ExpandElements::Yes,
         EmptyElements emptyElements = EmptyElements::No)
  {
    if (list) {
      this->assign(*list, expandElements, emptyElements);
    }
  }